

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborarray.cpp
# Opt level: O0

bool __thiscall QCborArray::contains(QCborArray *this,QCborValue *value)

{
  int iVar1;
  qsizetype qVar2;
  QCborValue *in_RSI;
  QCborArray *in_RDI;
  int cmp;
  qsizetype i;
  long lVar3;
  long lVar4;
  QCborArray *idx;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  lVar3 = 0;
  idx = in_RDI;
  while( true ) {
    lVar4 = lVar3;
    qVar2 = size(in_RDI);
    if (qVar2 <= lVar3) {
      return false;
    }
    QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x47619e);
    iVar1 = QCborContainerPrivate::compareElement
                      ((QCborContainerPrivate *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(qsizetype)idx,
                       in_RSI,(Comparison)((ulong)lVar4 >> 0x20));
    if (iVar1 == 0) break;
    lVar3 = lVar4 + 1;
  }
  return true;
}

Assistant:

bool QCborArray::contains(const QCborValue &value) const
{
    for (qsizetype i = 0; i < size(); ++i) {
        int cmp = d->compareElement(i, value, Comparison::ForEquality);
        if (cmp == 0)
            return true;
    }
    return false;
}